

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_stbvorbis_get_data_format
                    (ma_stbvorbis *pVorbis,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_result mVar1;
  
  if (pFormat != (ma_format *)0x0) {
    *pFormat = ma_format_unknown;
  }
  if (pChannels != (ma_uint32 *)0x0) {
    *pChannels = 0;
  }
  if (pSampleRate != (ma_uint32 *)0x0) {
    *pSampleRate = 0;
  }
  if (channelMapCap != 0 && pChannelMap != (ma_channel *)0x0) {
    memset(pChannelMap,0,channelMapCap);
  }
  if (pVorbis == (ma_stbvorbis *)0x0) {
    mVar1 = MA_INVALID_OPERATION;
  }
  else {
    if (pFormat != (ma_format *)0x0) {
      *pFormat = pVorbis->format;
    }
    if (pChannels != (ma_uint32 *)0x0) {
      *pChannels = pVorbis->channels;
    }
    if (pSampleRate != (ma_uint32 *)0x0) {
      *pSampleRate = pVorbis->sampleRate;
    }
    mVar1 = MA_SUCCESS;
    if (pChannelMap != (ma_channel *)0x0) {
      ma_channel_map_init_standard
                (ma_standard_channel_map_vorbis,pChannelMap,channelMapCap,pVorbis->channels);
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_stbvorbis_get_data_format(ma_stbvorbis* pVorbis, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    /* Defaults for safety. */
    if (pFormat != NULL) {
        *pFormat = ma_format_unknown;
    }
    if (pChannels != NULL) {
        *pChannels = 0;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = 0;
    }
    if (pChannelMap != NULL) {
        MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channelMapCap);
    }

    if (pVorbis == NULL) {
        return MA_INVALID_OPERATION;
    }

    if (pFormat != NULL) {
        *pFormat = pVorbis->format;
    }

    #if !defined(MA_NO_VORBIS)
    {
        if (pChannels != NULL) {
            *pChannels = pVorbis->channels;
        }

        if (pSampleRate != NULL) {
            *pSampleRate = pVorbis->sampleRate;
        }

        if (pChannelMap != NULL) {
            ma_channel_map_init_standard(ma_standard_channel_map_vorbis, pChannelMap, channelMapCap, pVorbis->channels);
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}